

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O3

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  bool bVar1;
  uint uVar2;
  StackIR *pSVar3;
  pointer ppSVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  StackInst *pSVar8;
  pointer ppSVar9;
  ulong uVar10;
  bool bVar11;
  
  pSVar3 = this->insts;
  ppSVar4 = (pSVar3->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(pSVar3->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4;
  if (uVar7 != 0) {
    bVar11 = false;
    uVar6 = 0;
    uVar10 = 1;
    do {
      pSVar8 = ppSVar4[uVar6];
      if (pSVar8 != (StackInst *)0x0) {
        if (bVar11) {
          if ((pSVar8->op < (TryTableEnd|BlockBegin)) && ((0x5eb4U >> (pSVar8->op & 0x1f) & 1) != 0)
             ) {
            bVar11 = false;
          }
          else {
            removeAt(this,(int)uVar10 - 1);
            pSVar3 = this->insts;
            ppSVar4 = (pSVar3->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            bVar11 = true;
          }
        }
        else {
          bVar11 = (pSVar8->type).id == 1;
        }
      }
      uVar7 = (long)(pSVar3->
                    super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4;
      bVar1 = uVar10 < (ulong)((long)uVar7 >> 3);
      uVar6 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar1);
  }
  if (8 < uVar7) {
    uVar7 = 1;
    uVar5 = 0;
    do {
      pSVar8 = ppSVar4[uVar7];
      if (((pSVar8 != (StackInst *)0x0) && (pSVar8->op == Basic)) &&
         (uVar2 = uVar5, pSVar8->origin->_id == UnreachableId)) {
        do {
          uVar6 = (ulong)uVar2;
          if (uVar2 == 0) {
            pSVar8 = *ppSVar4;
            ppSVar9 = ppSVar4;
            if (pSVar8 == (StackInst *)0x0) goto LAB_00cab218;
            goto LAB_00cab1fc;
          }
          pSVar8 = ppSVar4[uVar2];
          uVar2 = uVar2 - 1;
        } while (pSVar8 == (StackInst *)0x0);
        ppSVar9 = ppSVar4 + uVar6;
LAB_00cab1fc:
        if ((pSVar8->op == Basic) && (pSVar8->origin->_id == DropId)) {
          *ppSVar9 = (StackInst *)0x0;
          pSVar3 = this->insts;
          ppSVar4 = (pSVar3->
                    super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
LAB_00cab218:
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar5 = uVar5 + 1;
    } while (uVar7 < (ulong)((long)(pSVar3->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  return;
}

Assistant:

void StackIROptimizer::dce() {
  // Remove code after an unreachable instruction: anything after it, up to the
  // next control flow barrier, can simply be removed.
  bool inUnreachableCode = false;
  for (Index i = 0; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst) {
      continue;
    }
    if (inUnreachableCode) {
      // Does the unreachable code end here?
      if (isControlFlowBarrier(inst)) {
        inUnreachableCode = false;
      } else {
        // We can remove this.
        removeAt(i);
      }
    } else if (inst->type == Type::unreachable) {
      inUnreachableCode = true;
    }
  }

  // Remove code before an Unreachable. Consider this:
  //
  //  (drop
  //   ..
  //  )
  //  (unreachable)
  //
  // The drop is not needed, as the unreachable puts the stack in the
  // polymorphic state anyhow. Note that we don't need to optimize anything
  // other than a drop here, as in general the Binaryen IR DCE pass will handle
  // everything else. A drop followed by an unreachable is the only thing that
  // pass cannot handle, as the structured form of Binaryen IR does not allow
  // removing such a drop, and so we can only do it here in StackIR.
  //
  // TODO: We can look even further back, say if there is another drop of
  //       something before, then we can remove that drop as well. To do that
  //       we'd need to inspect the stack going backwards.
  for (Index i = 1; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst || inst->op != StackInst::Basic ||
        !inst->origin->is<Unreachable>()) {
      continue;
    }

    // Look back past nulls.
    Index j = i - 1;
    while (j > 0 && !insts[j]) {
      j--;
    }

    auto*& prev = insts[j];
    if (prev && prev->op == StackInst::Basic && prev->origin->is<Drop>()) {
      prev = nullptr;
    }
  }
}